

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::String> * __thiscall
kj::anon_unknown_35::InMemoryDirectory::asSymlink
          (Maybe<kj::String> *__return_storage_ptr__,InMemoryDirectory *this,
          Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,EntryImpl *entry)

{
  bool bVar1;
  SymlinkNode *pSVar2;
  Fault local_58;
  Fault f;
  String local_40;
  EntryImpl *local_28;
  EntryImpl *entry_local;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_local;
  InMemoryDirectory *this_local;
  
  local_28 = entry;
  entry_local = (EntryImpl *)lock;
  lock_local = (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)this;
  this_local = (InMemoryDirectory *)__return_storage_ptr__;
  bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::is<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>(&entry->node);
  if (bVar1) {
    pSVar2 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
             ::get<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>(&local_28->node);
    heapString(&local_40,&pSVar2->content);
    Maybe<kj::String>::Maybe(__return_storage_ptr__,&local_40);
    String::~String(&local_40);
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x652,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
    Maybe<kj::String>::Maybe(__return_storage_ptr__,(void *)0x0);
    _::Debug::Fault::~Fault(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<String> asSymlink(kj::Locked<const Impl>& lock, const EntryImpl& entry) const {
    if (entry.node.is<SymlinkNode>()) {
      return heapString(entry.node.get<SymlinkNode>().content);
    } else {
      KJ_FAIL_REQUIRE("not a symlink") { return nullptr; }
    }
  }